

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall
pstore::file::system_error::system_error
          (system_error *this,error_code code,czstring user_message,string *path)

{
  error_code __ec;
  char *local_58;
  string local_50;
  
  __ec._M_cat = code._M_cat;
  *(undefined ***)this = &PTR__system_error_0013b4a8;
  local_58 = "File";
  if (user_message != (czstring)0x0) {
    local_58 = user_message;
  }
  message<char_const*>(&local_50,this,&local_58,path);
  __ec._0_8_ = code._0_8_ & 0xffffffff;
  std::system_error::system_error(&this->super_system_error,__ec,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)this = &PTR__system_error_0013b4a8;
  std::__cxx11::string::string((string *)&this->path_,(string *)path);
  return;
}

Assistant:

system_error::system_error (std::error_code const code, gsl::czstring const user_message,
                                    std::string path)
                : std::system_error (
                      code, message (user_message != nullptr ? user_message : "File", path))
                , path_ (std::move (path)) {}